

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::PrecisionCase
          (PrecisionCase *this,Context *context,string *name,string *extension)

{
  char *name_00;
  pointer pcVar1;
  int iVar2;
  long lVar3;
  TestContext **ppTVar4;
  TestContext **ppTVar5;
  byte bVar6;
  
  bVar6 = 0;
  name_00 = (name->_M_dataplus)._M_p;
  tcu::TestCase::TestCase(&this->super_TestCase,context->testContext,name_00,name_00);
  (this->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__PrecisionCase_02167be8;
  (this->m_ctx).name._M_dataplus._M_p = (pointer)&(this->m_ctx).name.field_2;
  pcVar1 = (context->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_ctx,pcVar1,pcVar1 + (context->name)._M_string_length);
  ppTVar4 = &context->testContext;
  ppTVar5 = &(this->m_ctx).testContext;
  for (lVar3 = 0xe; lVar3 != 0; lVar3 = lVar3 + -1) {
    *ppTVar5 = *ppTVar4;
    ppTVar4 = ppTVar4 + (ulong)bVar6 * -2 + 1;
    ppTVar5 = ppTVar5 + (ulong)bVar6 * -2 + 1;
  }
  tcu::ResultCollector::ResultCollector(&this->m_status);
  iVar2 = tcu::CommandLine::getBaseSeed(context->testContext->m_cmdLine);
  deRandom_init(&(this->m_rnd).m_rnd,iVar2 + 0xdeadbeef);
  (this->m_extension)._M_dataplus._M_p = (pointer)&(this->m_extension).field_2;
  pcVar1 = (extension->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_extension,pcVar1,pcVar1 + extension->_M_string_length);
  return;
}

Assistant:

PrecisionCase	(const Context&		context,
										 const string&		name,
										 const string&		extension	= "")
							: TestCase		(context.testContext,
											 name.c_str(),
											 name.c_str())
							, m_ctx			(context)
							, m_status		()
							, m_rnd			(0xdeadbeefu +
											 context.testContext.getCommandLine().getBaseSeed())
							, m_extension	(extension)
	{
	}